

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEdge.c
# Opt level: O1

int Edg_ObjImprove(Gia_Man_t *p,int iObj,int nEdgeLimit,int DelayMax,int fVerbose)

{
  uint uVar1;
  int *piVar2;
  Vec_Int_t *pVVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  char *pcVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  uint uVar17;
  uint uVar18;
  int pFanouts [4];
  int pFanins [4];
  uint local_84;
  uint local_80;
  uint local_78;
  uint local_74;
  uint local_70;
  uint auStack_58 [4];
  uint auStack_48 [6];
  
  if (-1 < iObj) {
    uVar6 = (ulong)(uint)iObj;
    iVar10 = p->vEdgeDelayR->nSize;
    if (iObj < iVar10) {
      iVar12 = p->vMapping2->nSize;
      if (iObj < iVar12) {
        piVar2 = p->vEdgeDelayR->pArray;
        iVar13 = piVar2[uVar6];
        pVVar3 = p->vMapping2->pArray;
        uVar15 = 0;
        uVar7 = (ulong)(uint)pVVar3[uVar6].nSize;
        if (pVVar3[uVar6].nSize < 1) {
          uVar7 = uVar15;
        }
        uVar18 = 0;
        local_70 = 0;
        local_78 = 0;
        local_84 = 0;
        do {
          if (uVar7 == uVar15) {
            if (p->vEdgeDelay->nSize <= iObj) goto LAB_001fba28;
            iVar12 = p->vFanouts2->nSize;
            if (iObj < iVar12) {
              uVar15 = (ulong)local_84;
              pVVar3 = p->vFanouts2->pArray;
              uVar14 = 0;
              uVar7 = (ulong)(uint)pVVar3[uVar6].nSize;
              if (pVVar3[uVar6].nSize < 1) {
                uVar7 = uVar14;
              }
              iVar13 = p->vEdgeDelay->pArray[uVar6];
              uVar9 = 0;
              local_74 = 0;
              local_80 = 0;
              goto LAB_001fb541;
            }
            break;
          }
          if ((long)pVVar3[uVar6].nSize <= (long)uVar15) goto LAB_001fba28;
          uVar9 = pVVar3[uVar6].pArray[uVar15];
          lVar16 = (long)(int)uVar9;
          if ((lVar16 < 0) || (p->nObjs <= (int)uVar9)) goto LAB_001fba47;
          if ((~*(uint *)(p->pObjs + lVar16) & 0x1fffffff) != 0 &&
              -1 < (int)*(uint *)(p->pObjs + lVar16)) {
            if ((p->vEdgeDelay->nSize <= (int)uVar9) || (p->vEdge1->nSize <= iObj))
            goto LAB_001fba28;
            iVar8 = p->vEdgeDelay->pArray[lVar16];
            if (p->vEdge1->pArray[uVar6] != uVar9) {
              if (p->vEdge2->nSize <= iObj) goto LAB_001fba28;
              if (p->vEdge2->pArray[uVar6] != uVar9) {
                iVar8 = iVar8 + iVar13;
                if (DelayMax <= iVar8) {
                  __assert_fail("Delay1 + Delay2 + 1 <= DelayMax",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEdge.c"
                                ,0x32c,"int Edg_ObjImprove(Gia_Man_t *, int, int, int, int)");
                }
                if (iVar8 + 1 == DelayMax) {
                  lVar16 = (long)(int)local_84;
                  local_84 = local_84 + 1;
                  auStack_48[lVar16] = uVar9;
                }
                goto LAB_001fb4d0;
              }
            }
            uVar18 = uVar18 + 1;
            iVar8 = iVar8 + iVar13;
            if (DelayMax < iVar8) {
              __assert_fail("Delay1 + Delay2 <= DelayMax",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEdge.c"
                            ,0x324,"int Edg_ObjImprove(Gia_Man_t *, int, int, int, int)");
            }
            if (iVar8 == DelayMax) {
              local_78 = local_78 + 1;
            }
            else {
              local_70 = local_70 + 1;
            }
          }
LAB_001fb4d0:
          uVar15 = uVar15 + 1;
        } while (iObj < iVar12);
      }
      goto LAB_001fb634;
    }
  }
LAB_001fba28:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
LAB_001fb541:
  do {
    if (uVar7 == uVar14) {
      if (fVerbose != 0) {
        printf("%8d : ",uVar6);
        printf("Edges = %d  ",(ulong)uVar18);
        if (p->vMapping2->nSize <= iObj) break;
        printf("Fanins (all %d  EC %d  ENC %d  C %d)  ",
               (ulong)(uint)p->vMapping2->pArray[uVar6].nSize,(ulong)local_78,(ulong)local_70,
               (ulong)local_84);
        if (p->vFanouts2->nSize <= iObj) break;
        printf("Fanouts (all %d  EC %d  ENC %d  C %d)  ",
               (ulong)(uint)p->vFanouts2->pArray[uVar6].nSize,(ulong)local_74,(ulong)uVar9,
               (ulong)local_80);
      }
      if (nEdgeLimit < (int)uVar18) {
        __assert_fail("nEdges <= nEdgeLimit",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEdge.c"
                      ,0x358,"int Edg_ObjImprove(Gia_Man_t *, int, int, int, int)");
      }
      if (nEdgeLimit == uVar18) {
        if (fVerbose == 0) {
          return 0;
        }
        pcVar11 = "Full";
        goto LAB_001fba12;
      }
      if (((local_78 != 0) || (local_84 == 0)) || ((int)(nEdgeLimit - uVar18) < (int)local_84))
      goto LAB_001fb885;
      if ((int)local_84 < 1) {
        uVar14 = 0;
        goto LAB_001fb7a1;
      }
      uVar7 = 0;
      goto LAB_001fb748;
    }
    if ((long)pVVar3[uVar6].nSize <= (long)uVar14) goto LAB_001fba28;
    uVar1 = pVVar3[uVar6].pArray[uVar14];
    lVar16 = (long)(int)uVar1;
    if ((lVar16 < 0) || (p->nObjs <= (int)uVar1)) {
LAB_001fba47:
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    uVar17 = (uint)*(undefined8 *)(p->pObjs + lVar16);
    if (((int)uVar17 < 0) || ((uVar17 & 0x1fffffff) == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsAnd(Gia_ManObj(p, iNext))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEdge.c"
                    ,0x338,"int Edg_ObjImprove(Gia_Man_t *, int, int, int, int)");
    }
    if ((iVar10 <= (int)uVar1) || (p->vEdge1->nSize <= iObj)) goto LAB_001fba28;
    iVar8 = piVar2[lVar16];
    if (p->vEdge1->pArray[uVar6] == uVar1) {
LAB_001fb5de:
      uVar18 = uVar18 + 1;
      iVar8 = iVar8 + iVar13;
      if (DelayMax < iVar8) {
        __assert_fail("Delay1 + Delay2 <= DelayMax",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEdge.c"
                      ,0x33d,"int Edg_ObjImprove(Gia_Man_t *, int, int, int, int)");
      }
      if (iVar8 == DelayMax) {
        local_74 = local_74 + 1;
      }
      else {
        uVar9 = uVar9 + 1;
      }
    }
    else {
      if (p->vEdge2->nSize <= iObj) goto LAB_001fba28;
      if (p->vEdge2->pArray[uVar6] == uVar1) goto LAB_001fb5de;
      iVar8 = iVar8 + iVar13;
      if (DelayMax <= iVar8) {
        __assert_fail("Delay1 + Delay2 + 1 <= DelayMax",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEdge.c"
                      ,0x345,"int Edg_ObjImprove(Gia_Man_t *, int, int, int, int)");
      }
      if (iVar8 + 1 == DelayMax) {
        if ((int)local_80 < nEdgeLimit) {
          auStack_58[(int)local_80] = uVar1;
        }
        local_80 = local_80 + 1;
      }
    }
    uVar14 = uVar14 + 1;
  } while (iObj < iVar12);
LAB_001fb634:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
  while ((uVar14 = uVar7,
         (uint)(0 < p->vEdge2->pArray[lVar16]) + (uint)(0 < p->vEdge1->pArray[lVar16]) != nEdgeLimit
         && (uVar7 = uVar7 + 1, uVar14 = uVar15, uVar15 != uVar7))) {
LAB_001fb748:
    uVar9 = auStack_48[uVar7];
    lVar16 = (long)(int)uVar9;
    if (((lVar16 < 0) || (p->vEdge1->nSize <= (int)uVar9)) || (p->vEdge2->nSize <= (int)uVar9))
    goto LAB_001fba28;
  }
LAB_001fb7a1:
  if ((uint)uVar14 == local_84) {
    if (0 < (int)local_84) {
      pVVar3 = p->vEdge1;
      pVVar4 = p->vEdge2;
      uVar7 = 0;
      iVar10 = 0;
      do {
        if (pVVar3->nSize <= iObj) goto LAB_001fba28;
        uVar18 = auStack_48[uVar7];
        piVar5 = pVVar3->pArray;
        piVar2 = piVar5;
        if (piVar5[uVar6] == 0) {
LAB_001fb801:
          piVar2[uVar6] = uVar18;
          iVar12 = 0;
        }
        else {
          if (pVVar4->nSize <= iObj) goto LAB_001fba28;
          piVar2 = pVVar4->pArray;
          iVar12 = 1;
          if (piVar2[uVar6] == 0) goto LAB_001fb801;
        }
        if (((int)uVar18 < 0) || (pVVar3->nSize <= (int)uVar18)) goto LAB_001fba28;
        if (piVar5[uVar18] == 0) {
LAB_001fb843:
          piVar5[uVar18] = iObj;
          iVar13 = 0;
        }
        else {
          if (pVVar4->nSize <= (int)uVar18) goto LAB_001fba28;
          piVar5 = pVVar4->pArray;
          iVar13 = 1;
          if (piVar5[uVar18] == 0) goto LAB_001fb843;
        }
        iVar10 = iVar10 + iVar12 + iVar13;
        uVar7 = uVar7 + 1;
      } while (uVar15 != uVar7);
      if (iVar10 != 0) {
        puts("Wrong number of edges.");
      }
    }
    if (fVerbose == 0) {
      return 1;
    }
    pcVar11 = "Fixed %d critical fanins\n";
LAB_001fb9f7:
    iVar10 = 1;
    printf(pcVar11,(ulong)local_84);
  }
  else {
LAB_001fb885:
    if (((local_74 == 0) && (local_80 != 0)) && ((int)local_80 <= (int)(nEdgeLimit - uVar18))) {
      if ((int)local_80 < 1) {
        uVar7 = 0;
      }
      else {
        uVar7 = 0;
        do {
          uVar18 = auStack_58[uVar7];
          lVar16 = (long)(int)uVar18;
          if (((lVar16 < 0) || (p->vEdge1->nSize <= (int)uVar18)) ||
             (p->vEdge2->nSize <= (int)uVar18)) goto LAB_001fba28;
          if ((uint)(0 < p->vEdge2->pArray[lVar16]) + (uint)(0 < p->vEdge1->pArray[lVar16]) ==
              nEdgeLimit) goto LAB_001fb917;
          uVar7 = uVar7 + 1;
        } while (local_80 != uVar7);
        uVar7 = (ulong)local_80;
      }
LAB_001fb917:
      if ((uint)uVar7 == local_80) {
        if (0 < (int)local_80) {
          pVVar3 = p->vEdge1;
          pVVar4 = p->vEdge2;
          uVar7 = 0;
          iVar10 = 0;
          do {
            if (pVVar3->nSize <= iObj) goto LAB_001fba28;
            uVar18 = auStack_58[uVar7];
            piVar5 = pVVar3->pArray;
            piVar2 = piVar5;
            if (piVar5[uVar6] == 0) {
LAB_001fb978:
              piVar2[uVar6] = uVar18;
              iVar12 = 0;
            }
            else {
              if (pVVar4->nSize <= iObj) goto LAB_001fba28;
              piVar2 = pVVar4->pArray;
              iVar12 = 1;
              if (piVar2[uVar6] == 0) goto LAB_001fb978;
            }
            if (((int)uVar18 < 0) || (pVVar3->nSize <= (int)uVar18)) goto LAB_001fba28;
            if (piVar5[uVar18] == 0) {
LAB_001fb9bd:
              piVar5[uVar18] = iObj;
              iVar13 = 0;
            }
            else {
              if (pVVar4->nSize <= (int)uVar18) goto LAB_001fba28;
              piVar5 = pVVar4->pArray;
              iVar13 = 1;
              if (piVar5[uVar18] == 0) goto LAB_001fb9bd;
            }
            iVar10 = iVar10 + iVar12 + iVar13;
            uVar7 = uVar7 + 1;
          } while (local_80 != uVar7);
          if (iVar10 != 0) {
            puts("Wrong number of edges.");
          }
        }
        if (fVerbose == 0) {
          return 1;
        }
        pcVar11 = "Fixed %d critical fanouts\n";
        local_84 = local_80;
        goto LAB_001fb9f7;
      }
    }
    iVar10 = 0;
    if (fVerbose != 0) {
      pcVar11 = "Cannot fix";
LAB_001fba12:
      iVar10 = 0;
      puts(pcVar11);
    }
  }
  return iVar10;
}

Assistant:

int Edg_ObjImprove( Gia_Man_t * p, int iObj, int nEdgeLimit, int DelayMax, int fVerbose )
{
    int nFaninsC = 0,   nFanoutsC = 0;    // critical
    int nFaninsEC = 0,  nFanoutsEC = 0;   // edge-critical
    int nFaninsENC = 0, nFanoutsENC = 0;  // edge-non-critial
    int pFanins[4], pFanouts[4];
    int nEdgeDiff, nEdges = 0, Count = 0;
    int i, iNext, Delay1, Delay2;
    // count how many fanins have critical edge
    Delay1 = Vec_IntEntry( p->vEdgeDelayR, iObj );
    //if ( Delay1 > 1 )
    Gia_LutForEachFanin2( p, iObj, iNext, i )
    {
        if ( !Gia_ObjIsAnd(Gia_ManObj(p, iNext)) )
            continue;
        Delay2 = Vec_IntEntry( p->vEdgeDelay, iNext );
        if ( Gia_ObjHaveEdge(p, iObj, iNext) )
        {
            nEdges++;
            assert( Delay1 + Delay2 <= DelayMax );
            if ( Delay1 + Delay2 == DelayMax )
                nFaninsEC++;
            else
                nFaninsENC++;
        }
        else
        {
            assert( Delay1 + Delay2 + 1 <= DelayMax );
            if ( Delay1 + Delay2 + 1 == DelayMax )
                pFanins[nFaninsC++] = iNext;
        }
    }
    // count how many fanouts have critical edge
    Delay1 = Vec_IntEntry( p->vEdgeDelay, iObj );
    //if ( Delay2 < DelayMax - 1 )
    Gia_LutForEachFanout2( p, iObj, iNext, i )
    {
        //if ( !Gia_ObjIsAnd(Gia_ManObj(p, iNext)) )
        //    continue;
        assert( Gia_ObjIsAnd(Gia_ManObj(p, iNext)) );
        Delay2 = Vec_IntEntry( p->vEdgeDelayR, iNext );
        if ( Gia_ObjHaveEdge(p, iObj, iNext) )
        {
            nEdges++;
            assert( Delay1 + Delay2 <= DelayMax );
            if ( Delay1 + Delay2 == DelayMax )
                nFanoutsEC++;
            else
                nFanoutsENC++;
        }
        else
        {
            assert( Delay1 + Delay2 + 1 <= DelayMax );
            if ( Delay1 + Delay2 + 1 == DelayMax )
            {
                if ( nFanoutsC < nEdgeLimit )
                    pFanouts[nFanoutsC] = iNext;
                nFanoutsC++;
            }
        }
    }
    if ( fVerbose )
    {
        printf( "%8d : ", iObj );
        printf( "Edges = %d  ", nEdges );
        printf( "Fanins (all %d  EC %d  ENC %d  C %d)  ", 
            Gia_ObjLutSize2(p, iObj), nFaninsEC, nFaninsENC, nFaninsC );
        printf( "Fanouts (all %d  EC %d  ENC %d  C %d)  ", 
            Gia_ObjLutFanoutNum2(p, iObj), nFanoutsEC, nFanoutsENC, nFanoutsC );
    }
    // consider simple cases
    assert( nEdges <= nEdgeLimit );
    if ( nEdges == nEdgeLimit )
    {
        if ( fVerbose )
            printf( "Full\n" );
        return 0;
    }
    nEdgeDiff = nEdgeLimit - nEdges;
    // check if fanins or fanouts could be improved
    if ( nFaninsEC == 0 && nFaninsC && nFaninsC <= nEdgeDiff )
    {
        for ( i = 0; i < nFaninsC; i++ )
            if ( Gia_ObjEdgeCount(pFanins[i], p->vEdge1, p->vEdge2) == nEdgeLimit )
                break;
        if ( i == nFaninsC )
        {
            for ( i = 0; i < nFaninsC; i++ )
            {
                Count += Gia_ObjEdgeAdd( iObj, pFanins[i], p->vEdge1, p->vEdge2 );
                Count += Gia_ObjEdgeAdd( pFanins[i], iObj, p->vEdge1, p->vEdge2 );
            }
            if ( Count )
                printf( "Wrong number of edges.\n" );
            if ( fVerbose )
                printf( "Fixed %d critical fanins\n", nFaninsC );
            return 1;
        }
    }
    if ( nFanoutsEC == 0 && nFanoutsC && nFanoutsC <= nEdgeDiff )
    {
        for ( i = 0; i < nFanoutsC; i++ )
            if ( Gia_ObjEdgeCount(pFanouts[i], p->vEdge1, p->vEdge2) == nEdgeLimit )
                break;
        if ( i == nFanoutsC )
        {
            for ( i = 0; i < nFanoutsC; i++ )
            {
                Count += Gia_ObjEdgeAdd( iObj, pFanouts[i], p->vEdge1, p->vEdge2 );
                Count += Gia_ObjEdgeAdd( pFanouts[i], iObj, p->vEdge1, p->vEdge2 );
            }
            if ( Count )
                printf( "Wrong number of edges.\n" );
            if ( fVerbose )
                printf( "Fixed %d critical fanouts\n", nFanoutsC );
            return 1;
        }
    }
    if ( fVerbose )
        printf( "Cannot fix\n" );
    return 0;
}